

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void duckdb::MapFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  VectorType VVar1;
  data_ptr_t pdVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  byte bVar5;
  undefined8 uVar6;
  element_type *peVar7;
  undefined1 auVar8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  bool bVar10;
  reference pvVar11;
  reference pvVar12;
  Vector *pVVar13;
  idx_t iVar14;
  VectorBuffer *pVVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  _Head_base<0UL,_unsigned_long_*,_false> _Var17;
  Vector *this;
  ulong uVar18;
  ulong uVar19;
  idx_t iVar20;
  idx_t iVar21;
  idx_t iVar22;
  ulong uVar23;
  idx_t count;
  idx_t idx_in_entry;
  long lVar24;
  ulong uVar25;
  pair<std::__detail::_Node_iterator<duckdb::Value,_true,_true>,_bool> pVar26;
  SelectionVector sel_values;
  SelectionVector sel_keys;
  value_set_t unique_keys;
  UnifiedVectorFormat values_data;
  Value value;
  UnifiedVectorFormat keys_data;
  Vector keys_child_vector;
  UnifiedVectorFormat result_data;
  UnifiedVectorFormat keys_child_data;
  Vector values_child_vector;
  UnifiedVectorFormat values_child_data;
  idx_t local_388;
  ulong local_380;
  ulong local_378;
  _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_320;
  SelectionVector local_318;
  SelectionVector local_300;
  _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2e8;
  UnifiedVectorFormat local_2b0;
  Value local_268;
  UnifiedVectorFormat local_220;
  undefined1 local_1d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *ap_Stack_1d0 [6];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  UnifiedVectorFormat local_170;
  UnifiedVectorFormat local_128;
  Vector local_e0;
  UnifiedVectorFormat local_78;
  
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    count = args->count;
LAB_00fbc301:
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ListVector::SetListSize(result,0);
    VVar1 = result->vector_type;
    pVVar13 = result;
    while (VVar1 == DICTIONARY_VECTOR) {
      DictionaryVector::VerifyDictionary(pVVar13);
      pVVar15 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pVVar13->auxiliary);
      pVVar13 = (Vector *)(pVVar15 + 1);
      VVar1 = *(VectorType *)&pVVar15[1]._vptr_VectorBuffer;
    }
    pdVar2 = pVVar13->data;
    pdVar2[0] = '\0';
    pdVar2[1] = '\0';
    pdVar2[2] = '\0';
    pdVar2[3] = '\0';
    pdVar2[4] = '\0';
    pdVar2[5] = '\0';
    pdVar2[6] = '\0';
    pdVar2[7] = '\0';
    pdVar2[8] = '\0';
    pdVar2[9] = '\0';
    pdVar2[10] = '\0';
    pdVar2[0xb] = '\0';
    pdVar2[0xc] = '\0';
    pdVar2[0xd] = '\0';
    pdVar2[0xe] = '\0';
    pdVar2[0xf] = '\0';
    Vector::Verify(result,count);
    return;
  }
  pvVar11 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  if (((pvVar11->type).id_ == SQLNULL) || ((pvVar12->type).id_ == SQLNULL)) {
    FlatVector::VerifyFlatVector(result);
    _Var17._M_head_impl =
         (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (_Var17._M_head_impl == (unsigned_long *)0x0) {
      local_e0._0_8_ = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)local_1d8,(unsigned_long *)&local_e0);
      p_Var9 = ap_Stack_1d0[0];
      auVar8 = local_1d8;
      local_1d8 = (undefined1  [8])0x0;
      ap_Stack_1d0[0] = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)auVar8;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var9;
      if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
         ap_Stack_1d0[0] != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(ap_Stack_1d0[0]);
      }
      pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      _Var17._M_head_impl =
           (pTVar16->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           _Var17._M_head_impl;
    }
    *(byte *)_Var17._M_head_impl = (byte)*_Var17._M_head_impl & 0xfe;
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  else {
    count = args->count;
    if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00fbc301;
    pvVar11 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
    pvVar12 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_220);
    Vector::ToUnifiedFormat(pvVar11,count,&local_220);
    pVVar13 = ListVector::GetEntry(pvVar11);
    Vector::Vector((Vector *)local_1d8,pVVar13);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_128);
    iVar14 = ListVector::GetListSize(pvVar11);
    Vector::ToUnifiedFormat((Vector *)local_1d8,iVar14,&local_128);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_2b0);
    Vector::ToUnifiedFormat(pvVar12,count,&local_2b0);
    pVVar13 = ListVector::GetEntry(pvVar12);
    Vector::Vector(&local_e0,pVVar13);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    iVar14 = ListVector::GetListSize(pvVar12);
    Vector::ToUnifiedFormat(&local_e0,iVar14,&local_78);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_170);
    Vector::ToUnifiedFormat(result,count,&local_170);
    FlatVector::VerifyFlatVector(result);
    if (count == 0) {
      iVar14 = 0;
    }
    else {
      iVar14 = 0;
      iVar20 = 0;
      do {
        iVar21 = iVar20;
        if ((local_220.sel)->sel_vector != (sel_t *)0x0) {
          iVar21 = (idx_t)(local_220.sel)->sel_vector[iVar20];
        }
        iVar22 = iVar20;
        if ((local_2b0.sel)->sel_vector != (sel_t *)0x0) {
          iVar22 = (idx_t)(local_2b0.sel)->sel_vector[iVar20];
        }
        if (((local_220.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) ||
            ((local_220.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
              [iVar21 >> 6] >> (iVar21 & 0x3f) & 1) != 0)) &&
           ((local_2b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0 ||
            ((local_2b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
              [iVar22 >> 6] >> (iVar22 & 0x3f) & 1) != 0)))) {
          iVar14 = iVar14 + *(long *)(local_220.data + iVar21 * 0x10 + 8);
        }
        iVar20 = iVar20 + 1;
      } while (count != iVar20);
    }
    SelectionVector::SelectionVector(&local_300,iVar14);
    SelectionVector::SelectionVector(&local_318,iVar14);
    if (count == 0) {
      local_388 = 0;
    }
    else {
      local_388 = 0;
      uVar25 = 0;
      do {
        uVar19 = uVar25;
        if ((local_220.sel)->sel_vector != (sel_t *)0x0) {
          uVar19 = (ulong)(local_220.sel)->sel_vector[uVar25];
        }
        uVar18 = uVar25;
        if ((local_2b0.sel)->sel_vector != (sel_t *)0x0) {
          uVar18 = (ulong)(local_2b0.sel)->sel_vector[uVar25];
        }
        local_380 = uVar25;
        if ((local_170.sel)->sel_vector != (sel_t *)0x0) {
          local_380 = (ulong)(local_170.sel)->sel_vector[uVar25];
        }
        if (((local_220.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) ||
            ((local_220.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
              [uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0)) &&
           ((local_2b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0 ||
            ((local_2b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
              [uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0)))) {
          uVar23 = *(ulong *)(local_220.data + uVar19 * 0x10);
          lVar3 = *(long *)(local_220.data + uVar19 * 0x10 + 8);
          uVar19 = *(ulong *)(local_2b0.data + uVar18 * 0x10);
          if (lVar3 != *(long *)(local_2b0.data + uVar18 * 0x10 + 8)) {
            MapVector::EvalMapInvalidReason(NOT_ALIGNED);
          }
          local_2e8._M_buckets = &local_2e8._M_single_bucket;
          local_2e8._M_bucket_count = 1;
          local_2e8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_2e8._M_element_count = 0;
          local_2e8._M_rehash_policy._M_max_load_factor = 1.0;
          local_2e8._M_rehash_policy._M_next_resize = 0;
          local_2e8._M_single_bucket = (__node_base_ptr)0x0;
          iVar20 = local_388;
          for (lVar24 = lVar3; lVar24 != 0; lVar24 = lVar24 + -1) {
            uVar18 = uVar23;
            if ((local_128.sel)->sel_vector != (sel_t *)0x0) {
              uVar18 = (ulong)(local_128.sel)->sel_vector[uVar23];
            }
            local_378 = uVar19;
            if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
              local_378 = (ulong)(local_78.sel)->sel_vector[uVar19];
            }
            if ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
                 (unsigned_long *)0x0) &&
               ((local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                 [uVar18 >> 6] >> (uVar18 & 0x3f) & 1) == 0)) {
              MapVector::EvalMapInvalidReason(NULL_KEY);
            }
            Vector::GetValue(&local_268,(Vector *)local_1d8,uVar18);
            local_320 = &local_2e8;
            pVar26 = ::std::
                     _Hashtable<duckdb::Value,duckdb::Value,std::allocator<duckdb::Value>,std::__detail::_Identity,duckdb::ValueEquality,duckdb::ValueHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     ::
                     _M_insert<duckdb::Value_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::Value,true>>>>
                               ((_Hashtable<duckdb::Value,duckdb::Value,std::allocator<duckdb::Value>,std::__detail::_Identity,duckdb::ValueEquality,duckdb::ValueHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                 *)local_320,&local_268,&local_320);
            if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              MapVector::EvalMapInvalidReason(DUPLICATE_KEY);
            }
            local_300.sel_vector[iVar20] = (sel_t)uVar18;
            local_318.sel_vector[iVar20] = (sel_t)local_378;
            Value::~Value(&local_268);
            iVar20 = iVar20 + 1;
            uVar19 = uVar19 + 1;
            uVar23 = uVar23 + 1;
          }
          *(long *)(local_170.data + local_380 * 0x10 + 8) = lVar3;
          *(idx_t *)(local_170.data + local_380 * 0x10) = local_388;
          local_388 = local_388 + lVar3;
          ::std::
          _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&local_2e8);
        }
        else {
          _Var17._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var17._M_head_impl == (unsigned_long *)0x0) {
            local_2e8._M_buckets =
                 (__buckets_ptr)
                 (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_268,(unsigned_long *)&local_2e8);
            peVar7 = local_268.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            uVar6 = local_268.type_._0_8_;
            local_268.type_._0_8_ = (element_type *)0x0;
            local_268.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            p_Var4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar6;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7;
            if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
               local_268.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               (element_type *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_268.type_.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var17._M_head_impl =
                 (pTVar16->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var17._M_head_impl;
          }
          bVar5 = (byte)uVar25 & 0x3f;
          _Var17._M_head_impl[uVar25 >> 6] =
               _Var17._M_head_impl[uVar25 >> 6] &
               (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != count);
    }
    pVVar13 = MapVector::GetKeys(result);
    this = MapVector::GetValues(result);
    ListVector::SetListSize(result,local_388);
    Vector::Slice(pVVar13,(Vector *)local_1d8,&local_300,local_388);
    Vector::Flatten(pVVar13,local_388);
    Vector::Slice(this,&local_e0,&local_318,local_388);
    Vector::Flatten(this,local_388);
    pVVar13 = ListVector::GetEntry(result);
    FlatVector::VerifyFlatVector(pVVar13);
    ValidityMask::Resize(&pVVar13->validity,iVar14);
    bVar10 = DataChunk::AllConstant(args);
    if (bVar10) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
    Vector::Verify(result,count);
    if (local_318.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_318.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_300.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_300.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_170.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_170.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_170.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_e0.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_e0.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_e0.type);
    if (local_2b0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2b0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_2b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2b0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_128.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_128.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
    }
    if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
    }
    if (local_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)ap_Stack_1d0);
    if (local_220.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_220.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_220.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_220.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void MapFunction(DataChunk &args, ExpressionState &, Vector &result) {

	// internal MAP representation
	// - LIST-vector that contains STRUCTs as child entries
	// - STRUCTs have exactly two fields, a key-field, and a value-field
	// - key names are unique
	D_ASSERT(result.GetType().id() == LogicalTypeId::MAP);

	if (MapIsNull(args)) {
		auto &validity = FlatVector::Validity(result);
		validity.SetInvalid(0);
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		return;
	}

	auto row_count = args.size();

	// early-out, if no data
	if (args.data.empty()) {
		return MapFunctionEmptyInput(result, row_count);
	}

	auto &keys = args.data[0];
	auto &values = args.data[1];

	// a LIST vector, where each row contains a LIST of KEYS
	UnifiedVectorFormat keys_data;
	keys.ToUnifiedFormat(row_count, keys_data);
	auto keys_entries = UnifiedVectorFormat::GetData<list_entry_t>(keys_data);

	// the KEYs child vector
	auto keys_child_vector = ListVector::GetEntry(keys);
	UnifiedVectorFormat keys_child_data;
	keys_child_vector.ToUnifiedFormat(ListVector::GetListSize(keys), keys_child_data);

	// a LIST vector, where each row contains a LIST of VALUES
	UnifiedVectorFormat values_data;
	values.ToUnifiedFormat(row_count, values_data);
	auto values_entries = UnifiedVectorFormat::GetData<list_entry_t>(values_data);

	// the VALUEs child vector
	auto values_child_vector = ListVector::GetEntry(values);
	UnifiedVectorFormat values_child_data;
	values_child_vector.ToUnifiedFormat(ListVector::GetListSize(values), values_child_data);

	// a LIST vector, where each row contains a MAP (LIST of STRUCTs)
	UnifiedVectorFormat result_data;
	result.ToUnifiedFormat(row_count, result_data);
	auto result_entries = UnifiedVectorFormat::GetDataNoConst<list_entry_t>(result_data);

	auto &result_validity = FlatVector::Validity(result);

	// get the resulting size of the key/value child lists
	idx_t result_child_size = 0;
	for (idx_t row_idx = 0; row_idx < row_count; row_idx++) {
		auto keys_idx = keys_data.sel->get_index(row_idx);
		auto values_idx = values_data.sel->get_index(row_idx);
		if (!keys_data.validity.RowIsValid(keys_idx) || !values_data.validity.RowIsValid(values_idx)) {
			continue;
		}
		auto keys_entry = keys_entries[keys_idx];
		result_child_size += keys_entry.length;
	}

	// we need to slice potential non-flat vectors
	SelectionVector sel_keys(result_child_size);
	SelectionVector sel_values(result_child_size);
	idx_t offset = 0;

	for (idx_t row_idx = 0; row_idx < row_count; row_idx++) {

		auto keys_idx = keys_data.sel->get_index(row_idx);
		auto values_idx = values_data.sel->get_index(row_idx);
		auto result_idx = result_data.sel->get_index(row_idx);

		// NULL MAP
		if (!keys_data.validity.RowIsValid(keys_idx) || !values_data.validity.RowIsValid(values_idx)) {
			result_validity.SetInvalid(row_idx);
			continue;
		}

		auto keys_entry = keys_entries[keys_idx];
		auto values_entry = values_entries[values_idx];

		if (keys_entry.length != values_entry.length) {
			MapVector::EvalMapInvalidReason(MapInvalidReason::NOT_ALIGNED);
		}

		// set the selection vectors and perform a duplicate key check
		value_set_t unique_keys;
		for (idx_t child_idx = 0; child_idx < keys_entry.length; child_idx++) {

			auto key_idx = keys_child_data.sel->get_index(keys_entry.offset + child_idx);
			auto value_idx = values_child_data.sel->get_index(values_entry.offset + child_idx);

			// NULL check
			if (!keys_child_data.validity.RowIsValid(key_idx)) {
				MapVector::EvalMapInvalidReason(MapInvalidReason::NULL_KEY);
			}

			// unique check
			auto value = keys_child_vector.GetValue(key_idx);
			auto unique = unique_keys.insert(value).second;
			if (!unique) {
				MapVector::EvalMapInvalidReason(MapInvalidReason::DUPLICATE_KEY);
			}

			// set selection vectors
			sel_keys.set_index(offset + child_idx, key_idx);
			sel_values.set_index(offset + child_idx, value_idx);
		}

		// keys_entry and values_entry have the same length
		result_entries[result_idx].length = keys_entry.length;
		result_entries[result_idx].offset = offset;
		offset += keys_entry.length;
	}
	D_ASSERT(offset == result_child_size);

	auto &result_key_vector = MapVector::GetKeys(result);
	auto &result_value_vector = MapVector::GetValues(result);

	ListVector::SetListSize(result, offset);
	result_key_vector.Slice(keys_child_vector, sel_keys, offset);
	result_key_vector.Flatten(offset);
	result_value_vector.Slice(values_child_vector, sel_values, offset);
	result_value_vector.Flatten(offset);
	FlatVector::Validity(ListVector::GetEntry(result)).Resize(result_child_size);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(row_count);
}